

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O3

int LZ4_compress_HC_extStateHC_fastReset
              (void *state,char *src,char *dst,int srcSize,int dstCapacity,int compressionLevel)

{
  int iVar1;
  undefined2 uVar2;
  LZ4_streamHC_t *LZ4_streamHCPtr;
  ulong uVar3;
  int local_3c;
  char *local_38;
  
  iVar1 = 0;
  if (((ulong)state & 7) == 0) {
    local_3c = srcSize;
    local_38 = dst;
    if (*(char *)((long)state + 0x40027) == '\0') {
      uVar3 = *(long *)((long)state + 0x40000) - *(long *)((long)state + 0x40008);
      *(undefined8 *)((long)state + 0x40028) = 0;
      iVar1 = 0xc;
      if ((uint)compressionLevel < 0xc) {
        iVar1 = compressionLevel;
      }
      uVar2 = 9;
      if (0 < compressionLevel) {
        uVar2 = (undefined2)iVar1;
      }
      *(undefined2 *)((long)state + 0x40024) = uVar2;
      if (0x40000000 < uVar3) {
        uVar3 = 0;
        memset(state,0,0x20000);
        memset((void *)((long)state + 0x20000),0xff,0x20000);
      }
    }
    else {
      uVar3 = 0;
      memset(state,0,0x40030);
      iVar1 = 0xc;
      if ((uint)compressionLevel < 0xc) {
        iVar1 = compressionLevel;
      }
      uVar2 = 9;
      if (0 < compressionLevel) {
        uVar2 = (undefined2)iVar1;
      }
      *(undefined2 *)((long)state + 0x40024) = uVar2;
    }
    iVar1 = (int)uVar3 + 0x10000;
    *(int *)((long)state + 0x40020) = iVar1;
    *(char **)((long)state + 0x40008) = src + (-0x10000 - uVar3);
    *(char **)((long)state + 0x40000) = src;
    *(char **)((long)state + 0x40010) = src + (-0x10000 - uVar3);
    *(int *)((long)state + 0x40018) = iVar1;
    *(int *)((long)state + 0x4001c) = iVar1;
    iVar1 = LZ4_compressBound(srcSize);
    iVar1 = LZ4HC_compress_generic
                      ((LZ4HC_CCtx_internal *)state,src,local_38,&local_3c,dstCapacity,
                       compressionLevel,(uint)(dstCapacity < iVar1));
  }
  return iVar1;
}

Assistant:

int LZ4_compress_HC_extStateHC_fastReset (void* state, const char* src, char* dst, int srcSize, int dstCapacity, int compressionLevel)
{
    LZ4HC_CCtx_internal* const ctx = &((LZ4_streamHC_t*)state)->internal_donotuse;
    if (!LZ4_isAligned(state, LZ4_streamHC_t_alignment())) return 0;
    LZ4_resetStreamHC_fast((LZ4_streamHC_t*)state, compressionLevel);
    LZ4HC_init_internal (ctx, (const BYTE*)src);
    if (dstCapacity < LZ4_compressBound(srcSize))
        return LZ4HC_compress_generic (ctx, src, dst, &srcSize, dstCapacity, compressionLevel, limitedOutput);
    else
        return LZ4HC_compress_generic (ctx, src, dst, &srcSize, dstCapacity, compressionLevel, notLimited);
}